

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
InsertUniqueInTree(iterator *__return_storage_ptr__,InnerMap *this,size_type b,Node *node)

{
  pair<std::_Rb_tree_iterator<google::protobuf::MapKey_*>,_bool> pVar1;
  Node *local_20;
  
  node->next = (Node *)0x0;
  local_20 = node;
  pVar1 = std::
          _Rb_tree<google::protobuf::MapKey*,google::protobuf::MapKey*,std::_Identity<google::protobuf::MapKey*>,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::KeyCompare,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey*>>
          ::_M_insert_unique<google::protobuf::MapKey*>
                    ((_Rb_tree<google::protobuf::MapKey*,google::protobuf::MapKey*,std::_Identity<google::protobuf::MapKey*>,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::KeyCompare,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey*>>
                      *)this->table_[b],(MapKey **)&local_20);
  __return_storage_ptr__->node_ = *(Node **)(pVar1.first._M_node._M_node + 1);
  __return_storage_ptr__->m_ = this;
  __return_storage_ptr__->bucket_index_ = b & 0xfffffffffffffffe;
  return __return_storage_ptr__;
}

Assistant:

iterator InsertUniqueInTree(size_type b, Node* node) {
      GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
      // Maintain the invariant that node->next is NULL for all Nodes in Trees.
      node->next = NULL;
      return iterator(
          static_cast<Tree*>(table_[b])->insert(KeyPtrFromNodePtr(node)).first,
          this, b & ~static_cast<size_t>(1));
    }